

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall testing::InSequence::~InSequence(InSequence *this)

{
  Sequence *this_00;
  Sequence **ppSVar1;
  Sequence *local_18;
  InSequence *local_10;
  InSequence *this_local;
  
  if ((this->sequence_created_ & 1U) != 0) {
    local_10 = this;
    ppSVar1 = internal::ThreadLocal<testing::Sequence_*>::get
                        ((ThreadLocal<testing::Sequence_*> *)internal::g_gmock_implicit_sequence);
    this_00 = *ppSVar1;
    if (this_00 != (Sequence *)0x0) {
      Sequence::~Sequence(this_00);
      operator_delete(this_00);
    }
    local_18 = (Sequence *)0x0;
    internal::ThreadLocal<testing::Sequence_*>::set
              ((ThreadLocal<testing::Sequence_*> *)internal::g_gmock_implicit_sequence,&local_18);
  }
  return;
}

Assistant:

InSequence::~InSequence() {
  if (sequence_created_) {
    delete internal::g_gmock_implicit_sequence.get();
    internal::g_gmock_implicit_sequence.set(NULL);
  }
}